

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool goodToCopy(Options *options,QString *file,QStringList *unmetDependencies)

{
  bool bVar1;
  ulong uVar2;
  const_iterator o;
  QString *pQVar3;
  QString *in_RSI;
  Options *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QLatin1String QVar5;
  QString *lib;
  QStringList *__range1;
  bool ret;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList libs;
  QtDependency *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  QString *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff17;
  bool local_c9;
  char *local_c8;
  bool local_99;
  const_iterator options_00;
  const_iterator local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RSI;
  QVar4 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_ffffffffffffff08,
                     CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  local_c8 = (char *)QVar4.m_size;
  QVar5.m_data = local_c8;
  QVar5.m_size = (qsizetype)in_RSI;
  uVar2 = QString::endsWith(QVar5,(CaseSensitivity)QVar4.m_data);
  if ((uVar2 & 1) == 0) {
    local_99 = true;
  }
  else {
    bVar1 = checkArchitecture((Options *)
                              CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff08);
    if (bVar1) {
      local_c9 = true;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      getQtLibsFromElf(in_RDI,pQVar3);
      local_28.i = (QString *)0xaaaaaaaaaaaaaaaa;
      local_28 = QList<QString>::begin
                           ((QList<QString> *)
                            CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      o = QList<QString>::end((QList<QString> *)
                              CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      while (options_00.i = o.i, bVar1 = QList<QString>::const_iterator::operator!=(&local_28,o),
            bVar1) {
        pQVar3 = QList<QString>::const_iterator::operator*(&local_28);
        QHash<QString,_QList<QtDependency>_>::operator[]
                  ((QHash<QString,_QList<QtDependency>_> *)in_stack_ffffffffffffff08,
                   (QString *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        absoluteFilePath((Options *)options_00.i,o.i);
        QtDependency::QtDependency
                  ((QtDependency *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   pQVar3,(QString *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        bVar1 = QListSpecialMethodsBase<QtDependency>::contains<QtDependency>
                          ((QListSpecialMethodsBase<QtDependency> *)
                           CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                           in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff17 = bVar1 ^ 0xff;
        QtDependency::~QtDependency
                  ((QtDependency *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        QString::~QString((QString *)0x126d26);
        QList<QtDependency>::~QList((QList<QtDependency> *)0x126d33);
        in_stack_ffffffffffffff08 = pQVar3;
        o.i = options_00.i;
        if ((in_stack_ffffffffffffff17 & 1) != 0) {
          local_c9 = false;
          QList<QString>::append
                    ((QList<QString> *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00)
                     ,&in_stack_fffffffffffffef8->relativePath);
          in_stack_ffffffffffffff08 = pQVar3;
          o.i = options_00.i;
        }
        QList<QString>::const_iterator::operator++(&local_28);
      }
      local_99 = local_c9;
      QList<QString>::~QList((QList<QString> *)0x126d7c);
    }
    else {
      local_99 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_99;
}

Assistant:

bool goodToCopy(const Options *options, const QString &file, QStringList *unmetDependencies)
{
    if (!file.endsWith(".so"_L1))
        return true;

    if (!checkArchitecture(*options, file))
        return false;

    bool ret = true;
    const auto libs = getQtLibsFromElf(*options, file);
    for (const QString &lib : libs) {
        if (!options->qtDependencies[options->currentArchitecture].contains(QtDependency(lib, absoluteFilePath(options, lib)))) {
            ret = false;
            unmetDependencies->append(lib);
        }
    }

    return ret;
}